

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots.cpp
# Opt level: O0

void * parseFeatureDict(SymbolContext<char> *ctx)

{
  int iVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this;
  Ch *str;
  size_t __nbytes;
  void *__buf;
  SymbolContext<char> local_50;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_20;
  Document *ret;
  SymbolContext<char> *ctx_local;
  
  ret = (Document *)ctx;
  iVar1 = Centaurus::SymbolContext<char>::count(ctx);
  if (iVar1 < 1) {
    ctx_local = (SymbolContext<char> *)0x0;
  }
  else {
    this = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)operator_new(0x60);
    __nbytes = 0;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(this,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    local_20 = this;
    Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_50,(int)ret,__buf,__nbytes);
    str = (Ch *)std::__cxx11::string::c_str();
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::Parse(this,str);
    std::__cxx11::string::~string((string *)&local_50);
    ctx_local = (SymbolContext<char> *)local_20;
  }
  return ctx_local;
}

Assistant:

void *parseFeatureDict(const SymbolContext<char>& ctx)
{
  if (ctx.count() > 0) {
    auto ret = new rapidjson::Document;
    ret->Parse(ctx.read().c_str());
    return ret;
  }
  return nullptr;
}